

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O2

bool __thiscall KeyValueFile::loadFromString(KeyValueFile *this,char *data,char *debug_file_name)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_> *this_00;
  undefined7 uVar8;
  uint7 uVar9;
  ulong uVar7;
  undefined7 extraout_var;
  uint uVar10;
  char cVar11;
  byte bVar12;
  long lVar13;
  int iVar15;
  int iVar16;
  allocator<char> local_1d1;
  int local_1d0;
  uint local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  uint local_1bc;
  KeyValueFile *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  PrintErrorFunc local_160;
  int local_154;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  size_t local_f0;
  StringKeyValue x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  long lVar14;
  
  local_1b0 = &this->fileName;
  local_1b8 = this;
  std::__cxx11::string::assign((char *)local_1b0);
  if (data == (char *)0x0) {
    bVar12 = 0;
  }
  else {
    if ((*data == -0x11) && (data[1] == -0x45)) {
      data = data + (ulong)(data[2] == -0x41) * 3;
    }
    local_f0 = strlen(data);
    x.key._M_dataplus._M_p = (pointer)&x.key.field_2;
    x.key._M_string_length = 0;
    bVar5 = false;
    x.key.field_2._M_local_buf[0] = '\0';
    x.value._M_dataplus._M_p = (pointer)&x.value.field_2;
    x.value._M_string_length = 0;
    x.value.field_2._M_local_buf[0] = '\0';
    iVar2 = (int)local_f0;
    local_154 = iVar2 + -1;
    this_00 = &local_1b8->kv;
    uVar7 = 0;
    local_1cc = (uint)CONCAT71((int7)(local_f0 >> 8),1);
    local_1c8 = (PrintErrorFunc)((ulong)local_1c8._4_4_ << 0x20);
    local_1c0 = 0;
    local_1bc = 0;
    local_1d0 = 1;
    iVar16 = 0;
    while (iVar16 <= (int)local_f0) {
      cVar11 = data[iVar16];
      iVar15 = iVar16;
      if (cVar11 == '\\') {
        cVar11 = '\\';
        iVar15 = (int)local_f0;
        if (iVar16 != local_154) {
          uVar7 = 0;
          lVar14 = (long)iVar16;
          do {
            while( true ) {
              while( true ) {
                lVar13 = lVar14 + 1;
                iVar15 = iVar16;
                if (iVar2 <= lVar13) goto LAB_00124ce2;
                cVar1 = data[lVar13];
                if (cVar1 != ';') break;
                if (data[lVar14] == '\t') {
                  uVar7 = 1;
                }
                if (data[lVar14] == ' ') {
                  uVar7 = 1;
                }
                lVar14 = lVar13;
                if (uVar7 == 0) goto LAB_00124ce2;
              }
              if ((' ' < cVar1) && (uVar7 == 0)) goto LAB_00124ce2;
              if (cVar1 == '\r') break;
              lVar14 = lVar13;
              if (cVar1 == '\n') {
                uVar3 = 2;
                goto LAB_00124974;
              }
            }
            lVar4 = lVar14 + 2;
            lVar14 = lVar13;
          } while (data[lVar4] != '\n');
          uVar3 = 3;
LAB_00124974:
          local_188 = CONCAT44(local_188._4_4_,uVar3);
          if ((bVar5) && (local_160 = local_1b8->printErrorFunc, local_160 != (PrintErrorFunc)0x0))
          {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"ERROR: Line concatenation inside comment. At file \'",
                       &local_1d1);
            std::operator+(&local_130,&local_90,local_1b0);
            std::operator+(&local_180,&local_130,"\' line ");
            std::__cxx11::to_string(&local_150,local_1d0);
            std::operator+(&local_110,&local_180,&local_150);
            std::operator+(&local_1a8,&local_110,"\n");
            (*local_160)(local_1a8._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_90);
          }
          iVar15 = (int)local_188 + (int)lVar13 + -1;
          local_1d0 = local_1d0 + 1;
          local_188 = (long)iVar15;
          cVar11 = data[local_188];
          if ((' ' < cVar11 && cVar11 != ';') &&
             (local_160 = local_1b8->printErrorFunc, local_160 != (PrintErrorFunc)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,
                       "ERROR: The next line after the line concatenation symbol \'\\\' must be started with space. At file \'"
                       ,&local_1d1);
            std::operator+(&local_130,&local_90,local_1b0);
            std::operator+(&local_180,&local_130,"\' line ");
            std::__cxx11::to_string(&local_150,local_1d0);
            std::operator+(&local_110,&local_180,&local_150);
            std::operator+(&local_1a8,&local_110,"\n");
            (*local_160)(local_1a8._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_90);
            cVar11 = data[local_188];
          }
          goto LAB_00124b85;
        }
LAB_00124ce2:
        if (!bVar5) {
          uVar9 = (uint7)(uVar7 >> 8);
          if ((local_1cc & 1) == 0) {
            if ((cVar11 != '=') || (((ulong)local_1c8 & 1) != 0)) {
              if ((('\x1f' < cVar11) && (cVar11 == '=' || ((ulong)local_1c8 & 1) != 0)) ||
                 (uVar7 = (ulong)uVar9 << 8, (local_1bc & 1) != 0)) {
                uVar7 = std::__cxx11::string::push_back((char)&x + ' ');
              }
              goto LAB_00125075;
            }
            local_1cc = 0;
            uVar7 = CONCAT71(uVar9,1);
            local_1c8 = (PrintErrorFunc)CONCAT44(local_1c8._4_4_,(int)uVar7);
          }
          else {
            if (cVar11 == '=' || cVar11 < '!') goto LAB_00125032;
            local_1cc = (uint)CONCAT71(uVar9,1);
            uVar7 = std::__cxx11::string::push_back((char)&x);
          }
        }
      }
      else {
LAB_00124b85:
        if ((cVar11 != '\0') && (uVar7 = 0, cVar11 != '\n')) {
          if (cVar11 == ';') {
            if (iVar15 == 0) {
              iVar15 = 0;
            }
            else {
              uVar7 = (ulong)(byte)data[(long)iVar15 + -1];
              cVar11 = ';';
              if ((0x20 < uVar7) || ((0x100000600U >> (uVar7 & 0x3f) & 1) == 0)) goto LAB_00124ce2;
            }
            uVar7 = 0;
            bVar5 = true;
            goto LAB_00125085;
          }
          if (cVar11 != '\r') goto LAB_00124ce2;
        }
        std::__cxx11::string::string((string *)&local_50,(string *)&x);
        trimStr(&local_1a8,local_1b8,&local_50);
        std::__cxx11::string::operator=((string *)&x,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_70,(string *)&x.value);
        trimStr(&local_1a8,local_1b8,&local_70);
        std::__cxx11::string::operator=((string *)&x.value,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_70);
        if (x.key._M_string_length != 0) {
          if (((x.value._M_string_length == 0) || (((ulong)local_1c8 & 1) == 0)) ||
             ((local_1bc & 1) != 0)) {
            uVar8 = (undefined7)((ulong)local_1b8 >> 8);
            if ((local_1bc & 1) == 0) {
              if (((ulong)local_1c8 & 1) == 0) {
                local_1c8 = local_1b8->printErrorFunc;
                local_1c0 = (undefined4)CONCAT71(uVar8,1);
                if (local_1c8 != (PrintErrorFunc)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,"ERROR: Expected \'=\' at file \'",&local_1d1);
                  std::operator+(&local_130,&local_90,local_1b0);
                  std::operator+(&local_180,&local_130,"\' line ");
                  std::__cxx11::to_string(&local_150,local_1d0);
                  std::operator+(&local_110,&local_180,&local_150);
                  std::operator+(&local_1a8,&local_110,"\n");
                  (*local_1c8)(local_1a8._M_dataplus._M_p);
LAB_00124f86:
                  std::__cxx11::string::~string((string *)&local_1a8);
                  std::__cxx11::string::~string((string *)&local_110);
                  std::__cxx11::string::~string((string *)&local_150);
                  std::__cxx11::string::~string((string *)&local_180);
                  std::__cxx11::string::~string((string *)&local_130);
                  std::__cxx11::string::~string((string *)&local_90);
                }
              }
              else if (x.value._M_string_length == 0) {
                local_1c8 = local_1b8->printErrorFunc;
                local_1c0 = (undefined4)CONCAT71(uVar8,1);
                if (local_1c8 != (PrintErrorFunc)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,"ERROR: Expected value after \'=\' at file \'",
                             &local_1d1);
                  std::operator+(&local_130,&local_90,local_1b0);
                  std::operator+(&local_180,&local_130,"\' line ");
                  std::__cxx11::to_string(&local_150,local_1d0);
                  std::operator+(&local_110,&local_180,&local_150);
                  std::operator+(&local_1a8,&local_110,"\n");
                  (*local_1c8)(local_1a8._M_dataplus._M_p);
                  goto LAB_00124f86;
                }
              }
            }
            else if ((debug_file_name == (char *)0x0) || (*debug_file_name == '\0')) {
              local_1c8 = local_1b8->printErrorFunc;
              local_1c0 = (undefined4)CONCAT71(uVar8,1);
              if (local_1c8 != (PrintErrorFunc)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_90,
                           "ERROR: File name must be passed to loadFromString() when you are using \'include\'. At file \'"
                           ,&local_1d1);
                std::operator+(&local_130,&local_90,local_1b0);
                std::operator+(&local_180,&local_130,"\' line ");
                std::__cxx11::to_string(&local_150,local_1d0);
                std::operator+(&local_110,&local_180,&local_150);
                std::operator+(&local_1a8,&local_110,"\n");
                (*local_1c8)(local_1a8._M_dataplus._M_p);
                goto LAB_00124f86;
              }
            }
            else {
              bVar5 = includeFile(local_1b8,x.value._M_dataplus._M_p,local_1b8->includeDepth);
              local_1c0 = CONCAT31((int3)((uint)local_1c0 >> 8),(byte)local_1c0 | !bVar5);
            }
          }
          else {
            std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>
            ::push_back(this_00,&x);
          }
        }
        uVar9 = 0;
        x.key._M_string_length = 0;
        bVar5 = false;
        *x.key._M_dataplus._M_p = '\0';
        x.value._M_string_length = 0;
        *x.value._M_dataplus._M_p = '\0';
        local_1d0 = local_1d0 + (uint)(cVar11 == '\n');
        local_1c8 = (PrintErrorFunc)((ulong)local_1c8 & 0xffffffff00000000);
        local_1bc = 0;
LAB_00125032:
        if (x.key._M_string_length == 0) {
          uVar7 = CONCAT71(uVar9,1);
          local_1cc = (uint)uVar7;
        }
        else {
          uVar10 = (uint)local_1c8 & 0xff;
          if (cVar11 == '=') {
            uVar10 = 1;
          }
          local_1c8 = (PrintErrorFunc)CONCAT44(local_1c8._4_4_,uVar10);
          bVar6 = std::operator==(&x.key,"include");
          uVar7 = CONCAT71(extraout_var,bVar6);
          local_1bc = local_1bc & 0xff;
          if (bVar6) {
            local_1bc = 1;
          }
LAB_00125075:
          local_1cc = 0;
        }
      }
LAB_00125085:
      iVar16 = iVar15 + 1;
    }
    bVar12 = (byte)local_1c0 ^ 1;
    StringKeyValue::~StringKeyValue(&x);
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool loadFromString(const char * data, const char * debug_file_name = "")
  {
    fileName = debug_file_name;

    if (!data)
      return false;

    if (isUtf8Bom(data))
      data += 3;
    int len = int(strlen(data));

    StringKeyValue x;
    bool comment = false;
    bool readKey = true;
    bool eqFound = false;
    bool error = false;
    bool include = false;
    int line = 1;

    for (int i = 0; i <= len; i++)
    {
      char c = data[i];

      if (c == '\\')
      {
        if (i == len - 1)
          i++;
        else
        {
          bool commentAfterConcat = false;
          for (int j = i + 1; j < len; j++)
          {
            if (data[j] == ';' && isSpace(data[j - 1]))
              commentAfterConcat = true;

            if (!commentAfterConcat && data[j] > ' ')
              break;

            bool concat = false;
            if (data[j] == 0x0d && data[j + 1] == 0x0a)
            {
              line++;
              i = j + 2;
              concat = true;
            }
            else if (data[j] == 0x0a)
            {
              line++;
              i = j + 1;
              concat = true;
            }

            if (concat)
            {
              if (comment)
                if (printErrorFunc)
                  printErrorFunc((std::string("ERROR: Line concatenation inside comment. At file '") +
                    fileName + "' line " + std::to_string(line - 1) + "\n").c_str());

              if (data[i] > ' ' && data[i] != ';')
                if (printErrorFunc)
                  printErrorFunc((
                    std::string("ERROR: The next line after the line concatenation symbol '\\' must be started with space. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());

              c = data[i];
              break;
            }
          }
        }
      }

      if (c == 0x0d || c == 0x0a || c == 0)
      {
        x.key = trimStr(x.key);
        x.value = trimStr(x.value);
        if (!x.key.empty() && !x.value.empty() && eqFound && !include)
        {
          //printf("%s = \"%s\"\n", x.key.c_str(), x.value.c_str());
          kv.push_back(x);
        }
        else if (!x.key.empty())
        {
          if (include)
          {
            if (!debug_file_name || !debug_file_name[0])
            {
              if (printErrorFunc)
                printErrorFunc(
                  (std::string("ERROR: File name must be passed to loadFromString() when you are using 'include'. At file '") +
                    fileName + "' line " + std::to_string(line) + "\n").c_str());
              error = true;
            }
            else
            {
              bool ok = includeFile(x.value.c_str(), includeDepth);
              error |= !ok;
            }
          }
          else if (!eqFound)
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
          else if (x.value.empty())
          {
            if (printErrorFunc)
              printErrorFunc(
                (std::string("ERROR: Expected value after '=' at file '") + fileName + "' line " + std::to_string(line) + "\n").c_str());
            error = true;
          }
        }

        comment = false;
        readKey = true;
        eqFound = false;
        include = false;
        x.key.clear();
        x.value.clear();

        if (c == 0x0a)
          line++;
      }

      if (c == ';' && (i == 0 || isSpace(data[i - 1]) || data[i - 1] == 0x0a))
        comment = true;

      if (comment)
        continue;

      if (readKey)
      {
        if (!isSpace(c) && c > ' ' && c != '=')
          x.key += c;
        else if (!x.key.empty())
        {
          readKey = false;
          if (c == '=')
            eqFound = true;

          if (x.key == "include")
            include = true;
        }
      }
      else
      {
        if (c == '=' && !eqFound)
          eqFound = true;
        else if ((eqFound && c >= ' ') || include)
          x.value += c;
      }
    }

    return !error;
  }